

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

CURLcode Curl_ssl_session_create2
                   (void *sdata,size_t sdata_len,int ietf_tls_id,char *alpn,curl_off_t valid_until,
                   size_t earlydata_max,uchar *quic_tp,size_t quic_tp_len,
                   Curl_ssl_session **psession)

{
  CURLcode CVar1;
  Curl_ssl_session *pCVar2;
  char *pcVar3;
  Curl_ssl_session *s;
  
  if (sdata == (void *)0x0 || sdata_len == 0) {
    (*Curl_cfree)(sdata);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  *psession = (Curl_ssl_session *)0x0;
  pCVar2 = (Curl_ssl_session *)(*Curl_ccalloc)(1,0x60);
  if (pCVar2 == (Curl_ssl_session *)0x0) {
    (*Curl_cfree)(sdata);
    (*Curl_cfree)(quic_tp);
LAB_00172669:
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar2->ietf_tls_id = ietf_tls_id;
    pCVar2->valid_until = valid_until;
    pCVar2->earlydata_max = earlydata_max;
    pCVar2->sdata = sdata;
    pCVar2->sdata_len = sdata_len;
    pCVar2->quic_tp = quic_tp;
    pCVar2->quic_tp_len = quic_tp_len;
    if (alpn != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(alpn);
      pCVar2->alpn = pcVar3;
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(pCVar2->sdata);
        (*Curl_cfree)(pCVar2->quic_tp);
        (*Curl_cfree)(pCVar2->alpn);
        (*Curl_cfree)(pCVar2);
        goto LAB_00172669;
      }
    }
    *psession = pCVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode
Curl_ssl_session_create2(void *sdata, size_t sdata_len,
                         int ietf_tls_id, const char *alpn,
                         curl_off_t valid_until, size_t earlydata_max,
                         unsigned char *quic_tp, size_t quic_tp_len,
                         struct Curl_ssl_session **psession)
{
  struct Curl_ssl_session *s;

  if(!sdata || !sdata_len) {
    free(sdata);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  *psession = NULL;
  s = calloc(1, sizeof(*s));
  if(!s) {
    free(sdata);
    free(quic_tp);
    return CURLE_OUT_OF_MEMORY;
  }

  s->ietf_tls_id = ietf_tls_id;
  s->valid_until = valid_until;
  s->earlydata_max = earlydata_max;
  s->sdata = sdata;
  s->sdata_len = sdata_len;
  s->quic_tp = quic_tp;
  s->quic_tp_len = quic_tp_len;
  if(alpn) {
    s->alpn = strdup(alpn);
    if(!s->alpn) {
      cf_ssl_scache_sesssion_ldestroy(NULL, s);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *psession = s;
  return CURLE_OK;
}